

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

vector<Direction,_std::allocator<Direction>_> *
read_dirs(vector<Direction,_std::allocator<Direction>_> *__return_storage_ptr__,s_i *x,bool allowrel
         )

{
  bool bVar1;
  int iVar2;
  uint local_118;
  uint local_108;
  uint local_d4;
  point local_d0;
  int local_c8 [6];
  point local_b0;
  point p;
  point *__end3;
  point *__begin3;
  point (*__range3) [8];
  undefined4 local_88;
  point local_84;
  point local_7c;
  point local_74;
  point local_6c;
  point local_64;
  point local_5c;
  point local_54;
  point local_4c;
  point local_44;
  point local_3c;
  point local_34 [3];
  undefined1 local_1b;
  undefined1 local_1a;
  byte local_19;
  char ch;
  s_i *psStack_18;
  bool allowrel_local;
  s_i *x_local;
  vector<Direction,_std::allocator<Direction>_> *v;
  
  local_1a = 0;
  local_19 = allowrel;
  psStack_18 = x;
  x_local = (s_i *)__return_storage_ptr__;
  std::vector<Direction,_std::allocator<Direction>_>::vector(__return_storage_ptr__);
  do {
    iVar2 = s_i::get(psStack_18);
    local_1b = (undefined1)iVar2;
    switch(local_1b) {
    case 0x61:
      iVar2 = s_i::peek(psStack_18,0);
      bVar1 = digit(iVar2);
      if (bVar1) {
        local_108 = s_i::get(psStack_18);
        local_108 = local_108 & 7;
      }
      else {
        local_108 = 1;
      }
      std::vector<Direction,std::allocator<Direction>>::emplace_back<point_const&>
                ((vector<Direction,std::allocator<Direction>> *)__return_storage_ptr__,
                 DIRECTION_LIST + (int)local_108);
      break;
    case 0x62:
      local_c8[2] = 4;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,local_c8 + 2);
      break;
    case 99:
      local_c8[5] = 6;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,local_c8 + 5);
      break;
    case 100:
      local_4c.x = 0;
      local_4c.y = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_4c);
      break;
    case 0x65:
      iVar2 = s_i::peek(psStack_18,0);
      bVar1 = digit(iVar2);
      if (bVar1) {
        local_118 = s_i::get(psStack_18);
        local_118 = local_118 & 7;
      }
      else {
        local_118 = 1;
      }
      local_d4 = local_118;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)&local_d4);
      break;
    case 0x66:
      local_c8[3] = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,local_c8 + 3);
      break;
    default:
      __assert_fail("!\"This is not supposed to happen\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                    ,0x76,"vector<Direction> read_dirs(s_i &, bool)");
    case 0x6c:
      local_44.x = -1;
      local_44.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_44);
      break;
    case 0x6e:
      local_c8[1] = 2;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,local_c8 + 1);
      local_c8[0] = 6;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,local_c8);
      break;
    case 0x6f:
      local_54.x = 1;
      local_54.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_54);
      local_5c.x = 0;
      local_5c.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_5c);
      local_64.x = -1;
      local_64.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_64);
      local_6c.x = 0;
      local_6c.y = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_6c);
      break;
    case 0x72:
      local_34[0].x = 1;
      local_34[0].y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,local_34);
      break;
    case 0x73:
      local_d0.x = 0;
      local_d0.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_d0);
      break;
    case 0x75:
      local_3c.x = 0;
      local_3c.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_3c);
      break;
    case 0x77:
      local_c8[4] = 2;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,local_c8 + 4);
      break;
    case 0x79:
      local_74.x = 1;
      local_74.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_74);
      local_7c.x = -1;
      local_7c.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_7c);
      local_84.x = -1;
      local_84.y = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&local_84);
      __range3._4_4_ = 1;
      local_88 = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,(point *)((long)&__range3 + 4));
      break;
    case 0x7a:
      p = (point)Token::typeinfo_name;
      for (__end3 = DIRECTION_LIST; (point)__end3 != p; __end3 = __end3 + 1) {
        local_b0 = *__end3;
        std::vector<Direction,std::allocator<Direction>>::emplace_back<point&>
                  ((vector<Direction,std::allocator<Direction>> *)__return_storage_ptr__,&local_b0);
      }
    }
    iVar2 = s_i::peek(psStack_18,0);
    bVar1 = is_dir_inst(iVar2,(bool)(local_19 & 1));
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

vector<Direction> read_dirs(s_i &x, bool allowrel) {
    vector<Direction> v;
    do {
        char ch = x.get();
        switch (ch) {
        case INST_D_RIGHT:
            v.emplace_back( point{ 1, 0 } );
            break;
        case INST_D_UP:
            v.emplace_back( point{ 0, -1 } );
            break;
        case INST_D_LEFT:
            v.emplace_back( point{ -1, 0 } );
            break;
        case INST_D_DOWN:
            v.emplace_back( point{ 0, 1 } );
            break;
        case INST_D_ORTHOGONAL:
            v.emplace_back( point{ 1, 0 } );
            v.emplace_back( point{ 0, -1 } );
            v.emplace_back( point{ -1, 0 } );
            v.emplace_back( point{ 0, 1 } );
            break;
        case INST_D_DIAGONAL:
            v.emplace_back( point{ 1, -1 } );
            v.emplace_back( point{ -1, -1 } );
            v.emplace_back( point{ -1, 1 } );
            v.emplace_back( point{ 1, 1 } );
            break;
        case INST_D_OCTILINEAR:
            for (point p : DIRECTION_LIST) {
                v.emplace_back( p );
            }
            break;
        case INST_D_CLOCKWISE:
            v.emplace_back( 6 );
            break;
        case INST_D_COUNTERCLOCKWISE:
            v.emplace_back( 2 );
            break;
        case INST_D_FORWARD:
            v.emplace_back( 0 );
            break;
        case INST_D_BACKWARD:
            v.emplace_back( 4 );
            break;
        case INST_D_NORMAL:
            v.emplace_back( 2 );
            v.emplace_back( 6 );
            break;
        case INST_D_STATIONARY:
            v.emplace_back( point{ 0, 0 } );
            break;
        case INST_D_ABSNUM:
            v.emplace_back( DIRECTION_LIST[digit(x.peek()) ? x.get() & 7 : 1] );
            break;
        case INST_D_RELNUM:
            v.emplace_back( digit(x.peek()) ? x.get() & 7 : 1 );
            break;
        default:
            NEVERHAPPEN
        }
    } while (is_dir_inst(x.peek(), allowrel));
    return v;
}